

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O2

double __thiscall
Knn::computeDis(Knn *this,vector<double,_std::allocator<double>_> *v1,
               vector<double,_std::allocator<double>_> *v2)

{
  double dVar1;
  vector<double,_std::allocator<double>_> v;
  _Vector_base<double,_std::allocator<double>_> local_20;
  
  operator-<double,_double>((vector<double,_std::allocator<double>_> *)&local_20,v1,v2);
  dVar1 = operator*((vector<double,_std::allocator<double>_> *)&local_20,
                    (vector<double,_std::allocator<double>_> *)&local_20);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20);
  return dVar1;
}

Assistant:

double Knn::computeDis(const vector<double>& v1, const vector<double>& v2){
    auto v = v1 - v2;
    double di = v*v;
    return di;
}